

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flush-recognizer.cpp
# Opt level: O0

void __thiscall mahjong::FlushRecognizer::check(FlushRecognizer *this,Meld *meld)

{
  bool bVar1;
  Tile TVar2;
  reference pvVar3;
  reference pvVar4;
  int iVar5;
  int number;
  int suit;
  int code;
  Meld *meld_local;
  FlushRecognizer *this_local;
  
  bVar1 = Meld::isHonors(meld);
  if (bVar1) {
    this->has_honors = true;
  }
  else {
    TVar2 = Meld::frontTile(meld);
    iVar5 = (int)((long)((ulong)(uint)((int)((long)(int)TVar2 / 10) >> 0x1f) << 0x20 |
                        (long)(int)TVar2 / 10 & 0xffffffffU) % 10);
    pvVar3 = std::array<bool,_3UL>::operator[](&this->has_suit_tiles,(long)((int)TVar2 / 100 + -1));
    *pvVar3 = true;
    bVar1 = Meld::isSequence(meld);
    if (bVar1) {
      pvVar4 = std::array<int,_9UL>::operator[](&this->number_count,(long)(iVar5 + -1));
      *pvVar4 = *pvVar4 + 1;
      pvVar4 = std::array<int,_9UL>::operator[](&this->number_count,(long)iVar5);
      *pvVar4 = *pvVar4 + 1;
      pvVar4 = std::array<int,_9UL>::operator[](&this->number_count,(long)(iVar5 + 1));
      *pvVar4 = *pvVar4 + 1;
    }
    else {
      pvVar4 = std::array<int,_9UL>::operator[](&this->number_count,(long)(iVar5 + -1));
      *pvVar4 = *pvVar4 + 3;
      bVar1 = Meld::isQuad(meld);
      if (bVar1) {
        pvVar4 = std::array<int,_9UL>::operator[](&this->number_count,(long)(iVar5 + -1));
        *pvVar4 = *pvVar4 + 1;
      }
    }
  }
  return;
}

Assistant:

void FlushRecognizer::check(const Meld& meld)
{
	if (meld.isHonors())
	{
		has_honors = true;
	}
	else
	{
		auto code = static_cast<int>(meld.frontTile());
		auto suit = code / 100;
		auto number = code / 10 % 10;

		has_suit_tiles[suit - 1] = true;

		if (meld.isSequence())
		{
			number_count[number - 1 + 0]++;
			number_count[number - 1 + 1]++;
			number_count[number - 1 + 2]++;
		}
		else
		{
			number_count[number - 1] += 3;
			if (meld.isQuad()) number_count[number - 1]++;
		}
	}
}